

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_fp.c
# Opt level: O0

int fe(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  sunrealtype w;
  sunrealtype v;
  sunrealtype u;
  sunrealtype a;
  sunrealtype *rdata;
  void *user_data_local;
  N_Vector ydot_local;
  N_Vector y_local;
  sunrealtype t_local;
  
  dVar1 = **(double **)((long)y->content + 0x10);
  dVar2 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  dVar3 = *(double *)(*(long *)((long)y->content + 0x10) + 0x10);
  **(double **)((long)ydot->content + 0x10) =
       dVar2 * dVar1 * dVar1 + -(dVar3 + 1.0) * dVar1 + *user_data;
  *(double *)(*(long *)((long)ydot->content + 0x10) + 8) = dVar3 * dVar1 + -(dVar2 * dVar1 * dVar1);
  *(double *)(*(long *)((long)ydot->content + 0x10) + 0x10) = -dVar3 * dVar1;
  return 0;
}

Assistant:

static int fe(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype a = rdata[0];                     /* access data entries */
  sunrealtype u = NV_Ith_S(y, 0);               /* access solution values */
  sunrealtype v = NV_Ith_S(y, 1);
  sunrealtype w = NV_Ith_S(y, 2);

  /* fill in the RHS function */
  NV_Ith_S(ydot, 0) = a - (w + 1.0) * u + v * u * u;
  NV_Ith_S(ydot, 1) = w * u - v * u * u;
  NV_Ith_S(ydot, 2) = -w * u;

  return 0; /* Return with success */
}